

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userobject.cpp
# Opt level: O3

UserObject * __thiscall camp::UserObject::operator=(UserObject *this,UserObject *other)

{
  ParentObject *copy;
  UserProperty *pUVar1;
  element_type *peVar2;
  ParentObject *this_00;
  ParentObject *tmp;
  scoped_ptr<camp::ParentObject> local_30;
  
  copy = (other->m_parent).px;
  if (copy == (ParentObject *)0x0) {
    this_00 = (ParentObject *)0x0;
  }
  else {
    this_00 = (ParentObject *)operator_new(0x58);
    pUVar1 = copy->member;
    UserObject((UserObject *)this_00,&copy->object);
    this_00->member = pUVar1;
    UserObject(&this_00->lastValue);
  }
  peVar2 = (other->m_holder).
           super___shared_ptr<camp::detail::AbstractObjectHolder,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  this->m_class = other->m_class;
  (this->m_holder).
  super___shared_ptr<camp::detail::AbstractObjectHolder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_holder).
              super___shared_ptr<camp::detail::AbstractObjectHolder,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(other->m_holder).
              super___shared_ptr<camp::detail::AbstractObjectHolder,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  local_30.px = (this->m_parent).px;
  (this->m_parent).px = this_00;
  this->m_child = (UserObject *)0x0;
  if (this_00 != (ParentObject *)0x0) {
    (this_00->object).m_child = this;
  }
  boost::scoped_ptr<camp::ParentObject>::~scoped_ptr(&local_30);
  return this;
}

Assistant:

UserObject& UserObject::operator=(const UserObject& other)
{
    boost::scoped_ptr<ParentObject> parent(other.m_parent ? new ParentObject(other.m_parent->object, other.m_parent->member) : 0);

    m_class = other.m_class;
    m_holder = other.m_holder;
    m_parent.swap(parent);
    m_child = 0;

    if (m_parent)
        m_parent->object.m_child = this;

    return *this;
}